

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles3::Functional::FboApiCase::iterate(FboApiCase *this)

{
  pointer log_00;
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestContext *this_00;
  RenderContext *pRVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Vector<int,_4> local_1a0;
  undefined1 local_190 [8];
  GLContext context;
  TestLog *log;
  Functions *gl;
  FboApiCase *this_local;
  
  pRVar5 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar5->_vptr_RenderContext[3])();
  dVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(dVar2,"Before test case",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboApiTests.cpp"
                  ,0x22d);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  this_00 = gles3::Context::getTestContext((this->super_TestCase).m_context);
  context.m_programs.super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)tcu::TestContext::getLog(this_00);
  pRVar5 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  log_00 = context.m_programs.
           super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pRVar6 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[4])();
  iVar3 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var_00,iVar3));
  pRVar6 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[4])();
  iVar4 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_01,iVar4));
  tcu::Vector<int,_4>::Vector(&local_1a0,0,0,iVar3,iVar4);
  sglr::GLContext::GLContext((GLContext *)local_190,pRVar5,(TestLog *)log_00,1,&local_1a0);
  (*this->m_testFunc)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                      (Context *)local_190);
  sglr::GLContext::~GLContext((GLContext *)local_190);
  dVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(dVar2,"After test case",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboApiTests.cpp"
                  ,0x239);
  return STOP;
}

Assistant:

TestCase::IterateResult FboApiCase::iterate (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLU_EXPECT_NO_ERROR(gl.getError(), "Before test case");

	// Initialize result to PASS
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Execute test case
	{
		tcu::TestLog& log = m_context.getTestContext().getLog();
		sglr::GLContext context(m_context.getRenderContext(), log, sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(0, 0, m_context.getRenderContext().getRenderTarget().getWidth(), m_context.getRenderContext().getRenderTarget().getHeight()));
		m_testFunc(m_testCtx, context);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "After test case");

	return STOP;
}